

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

MODE ON_Texture::ModeFromUnsigned(uint mode_as_unsigned)

{
  MODE local_c;
  uint mode_as_unsigned_local;
  
  switch(mode_as_unsigned) {
  case 0:
    local_c = no_texture_mode;
    break;
  case 1:
    local_c = modulate_texture;
    break;
  case 2:
    local_c = decal_texture;
    break;
  case 3:
    local_c = blend_texture;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_material.cpp"
               ,0x989,"","Invalid mode_as_unsigned value.");
    local_c = no_texture_mode;
  }
  return local_c;
}

Assistant:

ON_Texture::MODE ON_Texture::ModeFromUnsigned( unsigned int mode_as_unsigned )
{
  switch(mode_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::no_texture_mode);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::modulate_texture);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::decal_texture);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_Texture::MODE::blend_texture);
  }

  ON_ERROR("Invalid mode_as_unsigned value.");
  return ON_Texture::MODE::no_texture_mode;
}